

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polygon.h
# Opt level: O3

Vector __thiscall anurbs::Polygon::vertex(Polygon *this,Index index)

{
  pointer pMVar1;
  pointer pMVar2;
  long lVar3;
  undefined8 *puVar4;
  long lVar5;
  long in_RDX;
  long *plVar6;
  long lVar7;
  double in_XMM1_Qa;
  Vector VVar8;
  
  lVar3 = *(long *)index;
  lVar5 = *(long *)(index + 8) - lVar3 >> 4;
  if (lVar5 <= in_RDX) {
    plVar6 = *(long **)(index + 0x18);
    while( true ) {
      if (plVar6 == *(long **)(index + 0x20)) {
        puVar4 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar4 = &__cxxabiv1::__pointer_type_info::vtable;
        __cxa_throw(puVar4,&std::exception::typeinfo,std::exception::~exception);
      }
      lVar3 = *plVar6;
      lVar7 = (plVar6[1] - lVar3 >> 4) + lVar5;
      if (in_RDX < lVar7) break;
      plVar6 = plVar6 + 3;
      lVar5 = lVar7;
    }
    in_RDX = in_RDX - lVar5;
  }
  puVar4 = (undefined8 *)(lVar3 + in_RDX * 0x10);
  pMVar1 = (pointer)*puVar4;
  pMVar2 = (pointer)puVar4[1];
  (this->outer_path).
  super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
  ._M_impl.super__Vector_impl_data._M_start = pMVar1;
  (this->outer_path).
  super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pMVar2;
  VVar8.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.m_data.array[1] =
       in_XMM1_Qa;
  VVar8.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.m_data.array[0] =
       (double)pMVar1;
  return (Vector)VVar8.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.m_data
                 .array;
}

Assistant:

Vector vertex(Index index) const
    {
        if (index < length(outer_path)) {
            return outer_path[index];
        }

        Index offset = length(outer_path);

        for (const auto& path : inner_paths) {
            if (index < offset + length(path)) {
                return path[index - offset];
            }

            offset += length(path);
        }

        throw std::exception();
    }